

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptBooleanObject * __thiscall
Js::JavascriptLibrary::CreateBooleanObject(JavascriptLibrary *this,BOOL value)

{
  code *pcVar1;
  bool bVar2;
  DynamicType **ppDVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptBooleanObject *this_00;
  JavascriptBoolean *value_00;
  TrackAllocData local_40;
  BOOL local_14;
  JavascriptLibrary *pJStack_10;
  BOOL value_local;
  JavascriptLibrary *this_local;
  
  local_14 = value;
  pJStack_10 = this;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->booleanTypeDynamic);
  if (*ppDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1b79,"(booleanTypeDynamic)","Where\'s booleanTypeDynamic?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&JavascriptBooleanObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1b7a);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
  this_00 = (JavascriptBooleanObject *)new<Memory::Recycler>(0x28,pRVar5,0x43c4b0);
  value_00 = CreateBoolean(this,local_14);
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->booleanTypeDynamic);
  JavascriptBooleanObject::JavascriptBooleanObject(this_00,value_00,*ppDVar3);
  return this_00;
}

Assistant:

JavascriptBooleanObject* JavascriptLibrary::CreateBooleanObject(BOOL value)
    {
        AssertMsg(booleanTypeDynamic, "Where's booleanTypeDynamic?");
        return RecyclerNew(this->GetRecycler(), JavascriptBooleanObject, CreateBoolean(value), booleanTypeDynamic);
    }